

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void adjust_endianness(MemoryRegion_conflict *mr,uint64_t *data,MemOp op)

{
  uint16_t uVar1;
  MemOp MVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  MemOp op_local;
  uint64_t *data_local;
  MemoryRegion_conflict *mr_local;
  
  MVar2 = devend_memop(mr->ops->endianness);
  if ((op & MO_BE) != MVar2) {
    switch(op & MO_64) {
    case MO_8:
      break;
    case MO_16:
      uVar1 = bswap16((uint16_t)*data);
      *data = (ulong)uVar1;
      break;
    case MO_32:
      uVar3 = bswap32((uint32_t)*data);
      *data = (ulong)uVar3;
      break;
    case MO_64:
      uVar4 = bswap64(*data);
      *data = uVar4;
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                 ,0x216,(char *)0x0);
    }
  }
  return;
}

Assistant:

static void adjust_endianness(MemoryRegion *mr, uint64_t *data, MemOp op)
{
    if ((op & MO_BSWAP) != devend_memop(mr->ops->endianness)) {
        switch (op & MO_SIZE) {
        case MO_8:
            break;
        case MO_16:
            *data = bswap16(*data);
            break;
        case MO_32:
            *data = bswap32(*data);
            break;
        case MO_64:
            *data = bswap64(*data);
            break;
        default:
            g_assert_not_reached();
        }
    }
}